

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

void __thiscall EOPlus::Parser::ParseGlobal(Parser *this)

{
  pointer pcVar1;
  Quest *pQVar2;
  Parser_Token_Server_Base *pPVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  runtime_error *prVar7;
  size_type *psVar8;
  Token *t_00;
  int iVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>,_bool>
  pVar10;
  Token t;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
  state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [24];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  bool local_228;
  bool bStack_227;
  bool bStack_226;
  bool bStack_225;
  bool bStack_224;
  undefined3 uStack_223;
  var_type local_220;
  int local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  undefined1 local_1d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> local_168;
  deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> local_118;
  variant local_c0;
  Token local_80;
  
  util::variant::variant(&local_c0);
  local_260._0_4_ = Invalid;
  local_260._8_4_ = local_c0.val_int;
  local_260._12_4_ = local_c0._4_4_;
  local_260._16_4_ = local_c0.val_float._0_4_;
  local_260._20_4_ = local_c0.val_float._4_4_;
  local_248._M_p = (pointer)&local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_c0.val_string._M_dataplus._M_p,
             local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
  local_220 = local_c0.type;
  local_228 = local_c0.val_bool;
  bStack_227 = local_c0.cache_val[0];
  bStack_226 = local_c0.cache_val[1];
  bStack_225 = local_c0.cache_val[2];
  bStack_224 = local_c0.cache_val[3];
  uStack_223 = local_c0._53_3_;
  local_218 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
    operator_delete(local_c0.val_string._M_dataplus._M_p,
                    local_c0.val_string.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_1d0 + 0x10;
  while( true ) {
    bVar4 = GetToken(this,(Token *)local_260,0x101);
    if (!bVar4) break;
    if (local_260._0_4_ == Identifier) {
      util::variant::GetString_abi_cxx11_((string *)local_1d0,(variant *)(local_260 + 8));
      iVar5 = std::__cxx11::string::compare((char *)local_1d0);
      if ((pointer)local_1d0._0_8_ != pcVar1) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      if (iVar5 == 0) {
        if (this->quest->has_info == true) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
          local_1d0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"Quest can only contain one main-block.","");
          pPVar3 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar5 = pPVar3->line;
          iVar9 = pPVar3->reject_line;
          std::runtime_error::runtime_error(prVar7,(string *)local_1d0);
          if (iVar9 < iVar5) {
            iVar9 = iVar5;
          }
          *(int *)(prVar7 + 0x10) = iVar9;
          *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
          __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        ParseMainBlock((Info *)local_1d0,this);
        pQVar2 = this->quest;
        std::__cxx11::string::operator=((string *)&pQVar2->info,(string *)local_1d0);
        (pQVar2->info).disabled = (bool)local_1d0[0x28];
        (pQVar2->info).version = local_1d0._32_4_;
        (pQVar2->info).hidden = local_1d0._36_4_;
        if ((pointer)local_1d0._0_8_ != pcVar1) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        this->quest->has_info = true;
      }
      else {
        util::variant::GetString_abi_cxx11_((string *)local_1d0,(variant *)(local_260 + 8));
        iVar5 = std::__cxx11::string::compare((char *)local_1d0);
        if ((pointer)local_1d0._0_8_ != pcVar1) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        if (iVar5 != 0) break;
        ParseStateBlock_abi_cxx11_
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
                    *)local_1d0,this);
        pVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,EOPlus::State>,std::_Select1st<std::pair<std::__cxx11::string_const,EOPlus::State>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                 ::_M_emplace_unique<std::pair<std::__cxx11::string,EOPlus::State>&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,EOPlus::State>,std::_Select1st<std::pair<std::__cxx11::string_const,EOPlus::State>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                             *)&this->quest->states,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
                             *)local_1d0);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
          std::operator+(&local_210,"State \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
          local_280._M_dataplus._M_p = (pointer)*plVar6;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_280._M_dataplus._M_p == psVar8) {
            local_280.field_2._M_allocated_capacity = *psVar8;
            local_280.field_2._8_8_ = plVar6[3];
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          }
          else {
            local_280.field_2._M_allocated_capacity = *psVar8;
          }
          local_280._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          pPVar3 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar5 = pPVar3->line;
          iVar9 = pPVar3->reject_line;
          std::runtime_error::runtime_error(prVar7,(string *)&local_280);
          if (iVar9 < iVar5) {
            iVar9 = iVar5;
          }
          *(int *)(prVar7 + 0x10) = iVar9;
          *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
          __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::~deque
                  ((deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)(local_1d0 + 0xb8));
        std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::~deque
                  ((deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *)(local_1d0 + 0x68));
        if (local_188._M_p != local_1d0 + 0x58) {
          operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1d0._32_8_ != local_1d0 + 0x30) {
          operator_delete((void *)local_1d0._32_8_,local_1a0._M_allocated_capacity + 1);
        }
        if ((pointer)local_1d0._0_8_ != pcVar1) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
      }
    }
    else if (local_260._0_4_ == EndOfFile) {
      if (this->quest->has_info != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_p != &local_238) {
          operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
        }
        return;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
      local_1d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"No main-block in quest file.","");
      pPVar3 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      iVar5 = pPVar3->line;
      iVar9 = pPVar3->reject_line;
      std::runtime_error::runtime_error(prVar7,(string *)local_1d0);
      if (iVar9 < iVar5) {
        iVar9 = iVar5;
      }
      *(int *)(prVar7 + 0x10) = iVar9;
      *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
      __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"Expected block-identifier (main/state) in global scope.","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_280._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_280._M_dataplus._M_p == psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar6[3];
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
  }
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Parser_Token_Server_Base::RejectToken
            (&local_80,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
  token_got_string_abi_cxx11_(&local_1f0,(EOPlus *)&local_80,t_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 &local_280,&local_1f0);
  pPVar3 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar5 = pPVar3->line;
  iVar9 = pPVar3->reject_line;
  std::runtime_error::runtime_error(prVar7,(string *)local_1d0);
  if (iVar9 < iVar5) {
    iVar9 = iVar5;
  }
  *(int *)(prVar7 + 0x10) = iVar9;
  *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
  __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::ParseGlobal()
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::EndOfFile))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "main")
				{
					if (quest.has_info)
						PARSER_ERROR("Quest can only contain one main-block.");

					quest.info = this->ParseMainBlock();
					quest.has_info = true;
				}
				else if (std::string(t.data) == "state")
				{
					auto state = this->ParseStateBlock();

					if (!this->quest.states.insert(state).second)
						PARSER_ERROR("State '" + state.first + "' already exists");
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::EndOfFile)
			{
				if (!quest.has_info)
					PARSER_ERROR("No main-block in quest file.");

				return;
			}
		}

		PARSER_ERROR_GOT("Expected block-identifier (main/state) in global scope.");
	}